

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O1

void ncnn::get_optimal_tile_mnk
               (int M,int N,int K,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
               int *TILE_M,int *TILE_N,int *TILE_K,int nT)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  float fVar7;
  
  uVar2 = get_cpu_level2_cache_size();
  if (nT == 0) {
    nT = get_physical_big_cpu_count();
  }
  if ((long)(int)uVar2 < 0) {
    fVar7 = (float)((ulong)(uVar2 & 1) | (ulong)(long)(int)uVar2 >> 1);
    fVar7 = fVar7 + fVar7;
  }
  else {
    fVar7 = (float)(int)uVar2;
  }
  auVar1 = vsqrtss_avx(ZEXT416((uint)(fVar7 * 0.083333336)),ZEXT416((uint)(fVar7 * 0.083333336)));
  uVar3 = (uint)auVar1._0_4_;
  uVar6 = uVar3 + 3;
  uVar2 = uVar3 + 7;
  if (-1 < (int)uVar3) {
    uVar6 = uVar3;
    uVar2 = uVar3;
  }
  uVar3 = 8;
  if (8 < (int)(uVar2 & 0xfffffff8)) {
    uVar3 = uVar2 & 0xfffffff8;
  }
  uVar2 = 4;
  if (4 < (int)(uVar6 & 0xfffffffc)) {
    uVar2 = uVar6 & 0xfffffffc;
  }
  *TILE_M = uVar3;
  *TILE_N = uVar2;
  *TILE_K = uVar3;
  if (0 < K) {
    iVar4 = (int)(K + uVar3 + -1) / (int)uVar3;
    iVar5 = (K + iVar4 + -1) / iVar4;
    uVar6 = iVar5 + 7;
    uVar2 = iVar5 + 0xe;
    if (-1 < (int)uVar6) {
      uVar2 = uVar6;
    }
    uVar6 = uVar2 & 0xfffffff8;
    if ((int)uVar3 <= (int)(uVar2 & 0xfffffff8)) {
      uVar6 = uVar3;
    }
    *TILE_K = uVar6;
    if (iVar4 == 1) {
      uVar6 = (uint)((fVar7 * 0.125) / (float)(int)uVar6);
      uVar2 = uVar6 + 7;
      if (-1 < (int)uVar6) {
        uVar2 = uVar6;
      }
      uVar3 = uVar6 + 3;
      if (-1 < (int)uVar6) {
        uVar3 = uVar6;
      }
      uVar6 = 8;
      if (8 < (int)(uVar2 & 0xfffffff8)) {
        uVar6 = uVar2 & 0xfffffff8;
      }
      *TILE_M = uVar6;
      uVar2 = 4;
      if (4 < (int)(uVar3 & 0xfffffffc)) {
        uVar2 = uVar3 & 0xfffffffc;
      }
      *TILE_N = uVar2;
    }
  }
  iVar5 = get_physical_cpu_count();
  if (nT <= iVar5) {
    iVar5 = nT;
  }
  uVar6 = iVar5 * *TILE_M;
  uVar2 = uVar6;
  if (0 < M) {
    iVar5 = (int)(M + uVar6 + -1) / (int)uVar6;
    iVar5 = (M + iVar5 + -1) / iVar5;
    uVar2 = iVar5 + 7;
    uVar3 = iVar5 + 0xe;
    if (-1 < (int)uVar2) {
      uVar3 = uVar2;
    }
    uVar2 = uVar3 & 0xfffffff8;
    if ((int)uVar6 <= (int)(uVar3 & 0xfffffff8)) {
      uVar2 = uVar6;
    }
  }
  *TILE_M = uVar2;
  if (0 < N) {
    uVar2 = *TILE_N;
    iVar5 = (int)(N + uVar2 + -1) / (int)uVar2;
    iVar5 = (N + iVar5 + -1) / iVar5;
    uVar3 = iVar5 + 3;
    uVar6 = iVar5 + 6;
    if (-1 < (int)uVar3) {
      uVar6 = uVar3;
    }
    uVar3 = uVar6 & 0xfffffffc;
    if ((int)uVar2 <= (int)(uVar6 & 0xfffffffc)) {
      uVar3 = uVar2;
    }
    *TILE_N = uVar3;
  }
  if (1 < nT) {
    uVar2 = *TILE_M;
    iVar5 = 1;
    if (1 < (int)uVar2 / nT) {
      iVar5 = (int)uVar2 / nT;
    }
    uVar6 = iVar5 + 7U & 0x7ffffff8;
    if ((int)uVar2 <= (int)uVar6) {
      uVar6 = uVar2;
    }
    *TILE_M = uVar6;
  }
  if (0 < constant_TILE_M) {
    *TILE_M = constant_TILE_M + 7U & 0x7ffffff8;
  }
  if (0 < constant_TILE_N) {
    *TILE_N = constant_TILE_N + 3U & 0x7ffffffc;
  }
  if (0 < constant_TILE_K) {
    *TILE_K = constant_TILE_K + 7U & 0x7ffffff8;
  }
  return;
}

Assistant:

static void get_optimal_tile_mnk(int M, int N, int K, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int& TILE_M, int& TILE_N, int& TILE_K, int nT)
{
    // resolve optimal tile size from cache size
    const size_t l2_cache_size = get_cpu_level2_cache_size();

    if (nT == 0)
        nT = get_physical_big_cpu_count();

    int tile_size = (int)sqrt((float)l2_cache_size / 3 / sizeof(float));

#if __AVX512F__
    TILE_M = std::max(16, tile_size / 16 * 16);
    TILE_N = std::max(4, tile_size / 4 * 4);
    TILE_K = std::max(16, tile_size / 16 * 16);
#elif __AVX__
    TILE_M = std::max(8, tile_size / 8 * 8);
    TILE_N = std::max(4, tile_size / 4 * 4);
    TILE_K = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
    TILE_M = std::max(4, tile_size / 4 * 4);
    TILE_N = std::max(4, tile_size / 4 * 4);
    TILE_K = std::max(4, tile_size / 4 * 4);
#else
    TILE_M = std::max(2, tile_size / 2 * 2);
    TILE_N = std::max(1, tile_size);
    TILE_K = std::max(2, tile_size / 2 * 2);
#endif

    if (K > 0)
    {
        int nn_K = (K + TILE_K - 1) / TILE_K;
#if __AVX512F__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 15) / 16 * 16);
#elif __AVX__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#elif __SSE2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 3) / 4 * 4);
#else
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 1) / 2 * 2);
#endif

        if (nn_K == 1)
        {
            tile_size = (int)((float)l2_cache_size / 2 / sizeof(float) / TILE_K);

#if __AVX512F__
            TILE_M = std::max(16, tile_size / 16 * 16);
            TILE_N = std::max(4, tile_size / 4 * 4);
#elif __AVX__
            TILE_M = std::max(8, tile_size / 8 * 8);
            TILE_N = std::max(4, tile_size / 4 * 4);
#elif __SSE2__
            TILE_M = std::max(4, tile_size / 4 * 4);
            TILE_N = std::max(4, tile_size / 4 * 4);
#else
            TILE_M = std::max(2, tile_size / 2 * 2);
            TILE_N = std::max(1, tile_size);
#endif
        }
    }

    TILE_M *= std::min(nT, get_physical_cpu_count());

    if (M > 0)
    {
        int nn_M = (M + TILE_M - 1) / TILE_M;
#if __AVX512F__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif
    }

    if (N > 0)
    {
        int nn_N = (N + TILE_N - 1) / TILE_N;
#if __AVX512F__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __AVX__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __SSE2__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#else
        TILE_N = std::min(TILE_N, (N + nn_N - 1) / nn_N);
#endif
    }

    if (nT > 1)
    {
#if __AVX512F__
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 1) / 2 * 2);
#endif
    }

    // always take constant TILE_M/N/K value when provided
    if (constant_TILE_M > 0)
    {
#if __AVX512F__
        TILE_M = (constant_TILE_M + 15) / 16 * 16;
#elif __AVX__
        TILE_M = (constant_TILE_M + 7) / 8 * 8;
#elif __SSE2__
        TILE_M = (constant_TILE_M + 3) / 4 * 4;
#else
        TILE_M = (constant_TILE_M + 1) / 2 * 2;
#endif
    }

    if (constant_TILE_N > 0)
    {
#if __AVX512F__
        TILE_N = (constant_TILE_N + 3) / 4 * 4;
#elif __AVX__
        TILE_N = (constant_TILE_N + 3) / 4 * 4;
#elif __SSE2__
        TILE_N = (constant_TILE_N + 3) / 4 * 4;
#else
        TILE_N = constant_TILE_N;
#endif
    }

    if (constant_TILE_K > 0)
    {
#if __AVX512F__
        TILE_K = (constant_TILE_K + 15) / 16 * 16;
#elif __AVX__
        TILE_K = (constant_TILE_K + 7) / 8 * 8;
#elif __SSE2__
        TILE_K = (constant_TILE_K + 3) / 4 * 4;
#else
        TILE_K = (constant_TILE_K + 1) / 2 * 2;
#endif
    }
}